

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O2

LispPTR CHAR_ioctl(LispPTR *args)

{
  uint uVar1;
  int iVar2;
  LispPTR *pLVar3;
  int *piVar4;
  LispPTR __fd;
  LispPTR LVar5;
  
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
  uVar1 = *args;
  if ((uVar1 & 0xfff0000) == 0xf0000) {
    __fd = uVar1 | 0xffff0000;
  }
  else if ((uVar1 & 0xfff0000) == 0xe0000) {
    __fd = uVar1 & 0xffff;
  }
  else {
    pLVar3 = NativeAligned4FromLAddr(uVar1);
    __fd = *pLVar3;
  }
  uVar1 = args[1];
  if ((uVar1 & 0xfff0000) == 0xf0000) {
    LVar5 = uVar1 | 0xffff0000;
  }
  else if ((uVar1 & 0xfff0000) == 0xe0000) {
    LVar5 = uVar1 & 0xffff;
  }
  else {
    pLVar3 = NativeAligned4FromLAddr(uVar1);
    LVar5 = *pLVar3;
  }
  pLVar3 = NativeAligned4FromLAddr(args[2]);
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 == 0) {
    alarm(TIMEOUT_TIME);
    piVar4 = __errno_location();
    do {
      *piVar4 = 0;
      iVar2 = ioctl(__fd,(long)(int)LVar5,pLVar3);
      if (iVar2 != -1) break;
    } while (*piVar4 == 4);
    alarm(0);
    if (iVar2 == 0) {
      return 0x4c;
    }
    err_mess("ioctl",*piVar4);
    iVar2 = *piVar4;
  }
  else {
    iVar2 = 100;
  }
  *Lisp_errno = iVar2;
  return 0;
}

Assistant:

LispPTR CHAR_ioctl(LispPTR *args)
{
#ifndef DOS
  int fd, request;
  void *data;
  int rval;
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
  fd = LispNumToCInt(args[0]);
  request = LispNumToCInt(args[1]);
  data = NativeAligned4FromLAddr(args[2]);
  ERRSETJMP(NIL);
  TIMEOUT(rval = ioctl(fd, request, data));
  if (rval != 0) {
    err_mess("ioctl", errno);
    *Lisp_errno = errno;
    return (NIL);
  }
  return (ATOM_T);
#endif /* DOS */
}